

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconintra.c
# Opt level: O2

void av1_highbd_dr_prediction_z3_c
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint16_t *puVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  
  bVar1 = (byte)upsample_left;
  uVar5 = 0;
  uVar11 = 0;
  if (0 < bh) {
    uVar11 = (ulong)(uint)bh;
  }
  lVar12 = (long)(bw + bh + -1 << (bVar1 & 0x1f));
  uVar4 = (ulong)(uint)bw;
  if (bw < 1) {
    uVar4 = uVar5;
  }
  iVar6 = dy;
  do {
    if (uVar5 == uVar4) {
      return;
    }
    uVar10 = (uint)(iVar6 << (bVar1 & 0x1f)) >> 1 & 0x1f;
    lVar9 = (long)(iVar6 >> (6 - bVar1 & 0x1f));
    uVar2 = 0;
    uVar8 = 0;
    puVar7 = dst;
    while( true ) {
      if (uVar11 == uVar8) goto LAB_0032fb20;
      if (lVar12 <= lVar9) break;
      *puVar7 = (uint16_t)
                (left[lVar9 + 1] * uVar10 + (uint)left[lVar9] * (0x20 - uVar10) + 0x10 >> 5);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + (1 << (bVar1 & 0x1f));
      puVar7 = puVar7 + stride;
      uVar2 = uVar2 + 1;
    }
    uVar3 = (ulong)uVar2;
    if ((int)uVar2 < bh) {
      uVar3 = (ulong)(uint)bh;
    }
    for (; uVar8 != uVar3; uVar3 = uVar3 - 1) {
      *puVar7 = left[lVar12];
      puVar7 = puVar7 + stride;
    }
LAB_0032fb20:
    uVar5 = uVar5 + 1;
    iVar6 = iVar6 + dy;
    dst = dst + 1;
  } while( true );
}

Assistant:

void av1_highbd_dr_prediction_z3_c(uint16_t *dst, ptrdiff_t stride, int bw,
                                   int bh, const uint16_t *above,
                                   const uint16_t *left, int upsample_left,
                                   int dx, int dy, int bd) {
  int r, c, y, base, shift, val;

  (void)above;
  (void)dx;
  (void)bd;
  assert(dx == 1);
  assert(dy > 0);

  const int max_base_y = (bw + bh - 1) << upsample_left;
  const int frac_bits = 6 - upsample_left;
  const int base_inc = 1 << upsample_left;
  y = dy;
  for (c = 0; c < bw; ++c, y += dy) {
    base = y >> frac_bits;
    shift = ((y << upsample_left) & 0x3F) >> 1;

    for (r = 0; r < bh; ++r, base += base_inc) {
      if (base < max_base_y) {
        val = left[base] * (32 - shift) + left[base + 1] * shift;
        dst[r * stride + c] = ROUND_POWER_OF_TWO(val, 5);
      } else {
        for (; r < bh; ++r) dst[r * stride + c] = left[max_base_y];
        break;
      }
    }
  }
}